

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::BasicReporter::startSpansLazily(BasicReporter *this)

{
  IConfig *pIVar1;
  char cVar2;
  long lVar3;
  ostream *poVar4;
  pointer pSVar5;
  SpanInfo *prevSpan;
  pointer pSVar6;
  char *local_50;
  long local_48;
  char local_40 [16];
  
  if ((this->m_testingSpan).emitted == false) {
    pIVar1 = (this->m_config).m_fullConfig.m_p;
    if (pIVar1 != (IConfig *)0x0) {
      (*(pIVar1->super_IShared).super_NonCopyable._vptr_NonCopyable[2])(pIVar1);
    }
    (*(pIVar1->super_IShared).super_NonCopyable._vptr_NonCopyable[6])(&local_50,pIVar1);
    lVar3 = local_48;
    if (local_50 != local_40) {
      operator_delete(local_50);
    }
    (*(pIVar1->super_IShared).super_NonCopyable._vptr_NonCopyable[3])(pIVar1);
    poVar4 = (this->m_config).m_stream;
    if (lVar3 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"[Started testing]",0x11);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"[Started testing: ",0x12);
      pIVar1 = (this->m_config).m_fullConfig.m_p;
      if (pIVar1 != (IConfig *)0x0) {
        (*(pIVar1->super_IShared).super_NonCopyable._vptr_NonCopyable[2])(pIVar1);
      }
      (*(pIVar1->super_IShared).super_NonCopyable._vptr_NonCopyable[6])(&local_50,pIVar1);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_50,local_48);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"]",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      if (local_50 != local_40) {
        operator_delete(local_50);
      }
      (*(pIVar1->super_IShared).super_NonCopyable._vptr_NonCopyable[3])(pIVar1);
    }
    (this->m_testingSpan).emitted = true;
  }
  if (((this->m_groupSpan).emitted == false) && ((this->m_groupSpan).name._M_string_length != 0)) {
    poVar4 = (this->m_config).m_stream;
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"[Started group: \'",0x11);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,(this->m_groupSpan).name._M_dataplus._M_p,
                        (this->m_groupSpan).name._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\']",2);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    (this->m_groupSpan).emitted = true;
  }
  if ((this->m_testSpan).emitted == false) {
    poVar4 = (this->m_config).m_stream;
    cVar2 = (char)poVar4;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + cVar2);
    std::ostream::put(cVar2);
    poVar4 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"[Running: ",10);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,(this->m_testSpan).name._M_dataplus._M_p,
                        (this->m_testSpan).name._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"]",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    (this->m_testSpan).emitted = true;
  }
  pSVar6 = (this->m_sectionSpans).
           super__Vector_base<Catch::BasicReporter::SpanInfo,_std::allocator<Catch::BasicReporter::SpanInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar5 = (this->m_sectionSpans).
           super__Vector_base<Catch::BasicReporter::SpanInfo,_std::allocator<Catch::BasicReporter::SpanInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (((pSVar6 != pSVar5) && (pSVar5[-1].emitted == false)) &&
     (pSVar5[-1].name._M_string_length != 0)) {
    if (this->m_firstSectionInTestCase == true) {
      std::__ostream_insert<char,std::char_traits<char>>((this->m_config).m_stream,"\n",1);
      this->m_firstSectionInTestCase = false;
      pSVar6 = (this->m_sectionSpans).
               super__Vector_base<Catch::BasicReporter::SpanInfo,_std::allocator<Catch::BasicReporter::SpanInfo>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pSVar5 = (this->m_sectionSpans).
               super__Vector_base<Catch::BasicReporter::SpanInfo,_std::allocator<Catch::BasicReporter::SpanInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
    for (; pSVar6 != pSVar5; pSVar6 = pSVar6 + 1) {
      if ((pSVar6->emitted == false) && ((pSVar6->name)._M_string_length != 0)) {
        poVar4 = (this->m_config).m_stream;
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"[Started section: \'",0x13);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,(pSVar6->name)._M_dataplus._M_p,(pSVar6->name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\']",2);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        pSVar6->emitted = true;
      }
    }
  }
  return;
}

Assistant:

void startSpansLazily() {
            if( !m_testingSpan.emitted ) {
                if( m_config.fullConfig()->name().empty() )
                    m_config.stream() << "[Started testing]" << std::endl;
                else
                    m_config.stream() << "[Started testing: " << m_config.fullConfig()->name() << "]" << std::endl;
                m_testingSpan.emitted = true;
            }

            if( !m_groupSpan.emitted && !m_groupSpan.name.empty() ) {
                m_config.stream() << "[Started group: '" << m_groupSpan.name << "']" << std::endl;
                m_groupSpan.emitted = true;
            }

            if( !m_testSpan.emitted ) {
                m_config.stream() << std::endl << "[Running: " << m_testSpan.name << "]" << std::endl;
                m_testSpan.emitted = true;
            }

            if( !m_sectionSpans.empty() ) {
                SpanInfo& sectionSpan = m_sectionSpans.back();
                if( !sectionSpan.emitted && !sectionSpan.name.empty() ) {
                    if( m_firstSectionInTestCase ) {
                        m_config.stream() << "\n";
                        m_firstSectionInTestCase = false;
                    }
                    std::vector<SpanInfo>::iterator it = m_sectionSpans.begin();
                    std::vector<SpanInfo>::iterator itEnd = m_sectionSpans.end();
                    for(; it != itEnd; ++it ) {
                        SpanInfo& prevSpan = *it;
                        if( !prevSpan.emitted && !prevSpan.name.empty() ) {
                            m_config.stream() << "[Started section: '" << prevSpan.name << "']" << std::endl;
                            prevSpan.emitted = true;
                        }
                    }
                }
            }
        }